

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_int8.h
# Opt level: O3

void ncnn::conv3x3s1_winograd23_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Option *opt)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  uint _c;
  int iVar26;
  int iVar27;
  int _c_00;
  int *piVar28;
  size_t sVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined4 uVar37;
  undefined4 uVar38;
  short asVar39 [4];
  short asVar40 [4];
  int iVar41;
  ulong uVar42;
  uint *puVar43;
  uint uVar44;
  int iVar45;
  ulong uVar46;
  short asVar47 [4];
  long lVar48;
  ulong uVar49;
  long lVar50;
  int iVar51;
  long lVar52;
  uint _h;
  long lVar53;
  long lVar54;
  uint uVar55;
  long lVar56;
  long lVar57;
  ulong uVar58;
  ulong uVar59;
  uint uVar60;
  uint *puVar61;
  long lVar62;
  ulong uVar63;
  void *pvVar64;
  uint *puVar65;
  long lVar66;
  void *pvVar67;
  uint *puVar68;
  long lVar69;
  void *pvVar70;
  uint uVar71;
  void *pvVar72;
  uint uVar73;
  ulong uVar74;
  void *pvVar75;
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  void *local_3b8;
  ulong local_3b0;
  void *local_3a8;
  void *local_390;
  int tiles;
  int nRowBlocks;
  int nColBlocks;
  void *local_330;
  void *local_328;
  void *local_320;
  int local_308;
  short d1 [4];
  undefined1 local_238 [64];
  size_t local_1f8;
  short d0 [4];
  Mat local_198;
  Mat *local_150;
  ulong local_148;
  int local_13c;
  short d2 [4];
  short d3 [4];
  int sum3 [16];
  Option opt_b;
  undefined1 auVar77 [16];
  
  _c = bottom_blob->c;
  iVar26 = top_blob->w;
  iVar27 = top_blob->h;
  _c_00 = top_blob->c;
  uVar42 = (ulong)_c_00;
  piVar28 = bottom_blob->refcount;
  local_198.data = bottom_blob->data;
  local_198.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_198.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_198.elemsize = bottom_blob->elemsize;
  local_198.elempack = bottom_blob->elempack;
  local_198.allocator = bottom_blob->allocator;
  iVar45 = bottom_blob->h;
  iVar41 = bottom_blob->w;
  uVar37 = bottom_blob->dims;
  uVar38 = bottom_blob->w;
  local_198.h = bottom_blob->h;
  local_198.d = bottom_blob->d;
  local_198.cstep = bottom_blob->cstep;
  if (piVar28 != (int *)0x0) {
    LOCK();
    *piVar28 = *piVar28 + 1;
    UNLOCK();
    iVar41 = bottom_blob->w;
    iVar45 = bottom_blob->h;
  }
  uVar71 = (iVar26 - (iVar26 + 1 >> 0x1f)) + 1;
  uVar60 = uVar71 & 0xfffffffe;
  local_148 = (ulong)uVar60;
  uVar73 = (iVar27 - (iVar27 + 1 >> 0x1f)) + 1;
  _h = uVar73 & 0xfffffffe;
  iVar51 = uVar60 + 2;
  opt_b.lightmode = opt->lightmode;
  opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt_b.num_threads = opt->num_threads;
  opt_b.workspace_allocator = opt->workspace_allocator;
  opt_b.openmp_blocktime = opt->openmp_blocktime;
  opt_b.use_winograd_convolution = opt->use_winograd_convolution;
  opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_b.use_int8_inference = opt->use_int8_inference;
  opt_b.use_vulkan_compute = opt->use_vulkan_compute;
  opt_b.use_bf16_storage = opt->use_bf16_storage;
  opt_b.use_fp16_packed = opt->use_fp16_packed;
  opt_b.use_fp16_storage = opt->use_fp16_storage;
  opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  opt_b.use_int8_packed = opt->use_int8_packed;
  opt_b.use_int8_storage = opt->use_int8_storage;
  opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
  opt_b.use_packing_layout = opt->use_packing_layout;
  opt_b.use_shader_pack8 = opt->use_shader_pack8;
  opt_b.use_subgroup_basic = opt->use_subgroup_basic;
  opt_b.use_subgroup_vote = opt->use_subgroup_vote;
  opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
  opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  opt_b.use_image_storage = opt->use_image_storage;
  opt_b.use_tensor_storage = opt->use_tensor_storage;
  opt_b.use_reserved_0 = opt->use_reserved_0;
  opt_b.flush_denormals = opt->flush_denormals;
  opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
  opt_b.use_shader_local_memory = opt->use_shader_local_memory;
  opt_b.use_cooperative_matrix = opt->use_cooperative_matrix;
  opt_b.use_winograd23_convolution = opt->use_winograd23_convolution;
  opt_b.use_winograd43_convolution = opt->use_winograd43_convolution;
  opt_b.use_winograd63_convolution = opt->use_winograd63_convolution;
  opt_b.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
  opt_b.use_reserved_7 = opt->use_reserved_7;
  opt_b.use_reserved_8 = opt->use_reserved_8;
  opt_b.use_reserved_9 = opt->use_reserved_9;
  opt_b.use_reserved_10 = opt->use_reserved_10;
  opt_b.use_reserved_11 = opt->use_reserved_11;
  opt_b.blob_allocator = opt->workspace_allocator;
  local_198.dims = uVar37;
  local_198.w = uVar38;
  local_198.c = _c;
  local_150 = top_blob;
  copy_make_border(bottom_blob,&local_198,0,(_h - iVar45) + 2,0,iVar51 - iVar41,0,0.0,&opt_b);
  uVar71 = (int)uVar71 >> 1;
  uVar73 = (int)uVar73 >> 1;
  local_1f8 = 0;
  uVar60 = uVar73 * uVar71;
  local_238._0_8_ = (void *)0x0;
  local_238._8_4_ = 0;
  local_238._12_4_ = 0;
  local_238._16_8_ = 0;
  local_238._24_4_ = 0;
  local_238._32_8_ = (Allocator *)0x0;
  local_238._40_4_ = 0;
  local_238._44_4_ = 0;
  local_238._48_12_ = SUB1612((undefined1  [16])0x0,4);
  Mat::create((Mat *)local_238,0x10,uVar60,_c,2,opt->workspace_allocator);
  auVar2 = _DAT_00567480;
  auVar76 = _DAT_00567470;
  uVar58 = (ulong)_c;
  if (0 < (int)_c) {
    lVar53 = (long)iVar51;
    uVar55 = 1;
    if (1 < (int)uVar71) {
      uVar55 = uVar71;
    }
    uVar59 = 1;
    if (1 < (int)uVar73) {
      uVar59 = (ulong)uVar73;
    }
    uVar63 = 0;
    do {
      if (0 < iVar27) {
        pvVar72 = (void *)(local_1f8 * local_238._16_8_ * uVar63 + local_238._0_8_);
        uVar74 = 0;
        do {
          if (0 < iVar26) {
            puVar65 = (uint *)((long)local_198.data +
                              (long)(iVar51 * 2 * (int)uVar74) +
                              local_198.cstep * local_198.elemsize * uVar63);
            puVar68 = (uint *)((long)puVar65 + lVar53);
            puVar43 = (uint *)(lVar53 + (long)puVar68);
            puVar61 = (uint *)((long)puVar43 + lVar53);
            uVar44 = 0;
            do {
              auVar80 = vpmovsxbw_avx(ZEXT416(*puVar65));
              auVar79 = vpmovsxbw_avx(ZEXT416(*puVar68));
              auVar30 = vpmovsxbw_avx(ZEXT416(*puVar43));
              auVar31 = vpmovsxbw_avx(ZEXT416(*puVar61));
              auVar34 = vpsubw_avx(auVar80,auVar30);
              auVar80 = vpaddw_avx(auVar79,auVar30);
              auVar35 = vpsubw_avx(auVar30,auVar79);
              auVar36 = vpsubw_avx(auVar31,auVar79);
              auVar79 = vpsrld_avx(auVar34,0x10);
              auVar30 = vpshufd_avx(auVar34,0x55);
              auVar81 = vpsrlq_avx(auVar34,0x30);
              auVar34 = vpunpcklwd_avx(auVar34,auVar80);
              auVar79 = vpblendw_avx(auVar79,auVar80,2);
              auVar31 = vpshufd_avx(auVar80,0x55);
              auVar30 = vpunpcklwd_avx(auVar30,auVar31);
              auVar80 = vpsrlq_avx(auVar80,0x30);
              auVar31 = vpunpcklwd_avx(auVar81,auVar80);
              auVar34 = vpunpckldq_avx(auVar34,auVar35);
              auVar80 = vpsrld_avx(auVar35,0x10);
              auVar81 = vpunpckldq_avx(auVar79,auVar80);
              auVar80 = vpblendw_avx(auVar30,auVar35,0xc);
              auVar79 = vpsrlq_avx(auVar35,0x30);
              auVar35 = vpunpckldq_avx(auVar31,auVar79);
              auVar79 = vpunpcklwd_avx(auVar34,auVar36);
              auVar30 = vpshufb_avx(auVar79,auVar76);
              auVar79 = vpunpcklwd_avx(auVar81,auVar36);
              auVar31 = vpshufb_avx(auVar79,auVar2);
              auVar80 = vpunpcklwd_avx(auVar80,auVar36);
              auVar80 = vpshuflw_avx(auVar80,0xe8);
              auVar34 = vpshufd_avx(auVar80,0xe8);
              auVar79 = vpblendw_avx(auVar35,auVar36,8);
              auVar80 = vpsubw_avx(auVar30,auVar34);
              asVar47 = auVar80._0_8_;
              d0[0] = asVar47[0];
              d0[1] = asVar47[1];
              d0[2] = asVar47[2];
              d0[3] = asVar47[3];
              auVar80 = vpaddw_avx(auVar31,auVar34);
              asVar47 = auVar80._0_8_;
              d1[0] = asVar47[0];
              d1[1] = asVar47[1];
              d1[2] = asVar47[2];
              d1[3] = asVar47[3];
              auVar80 = vpsubw_avx(auVar34,auVar31);
              asVar47 = auVar80._0_8_;
              d2[0] = asVar47[0];
              d2[1] = asVar47[1];
              d2[2] = asVar47[2];
              d2[3] = asVar47[3];
              auVar80 = vpsubw_avx(auVar79,auVar31);
              asVar47 = auVar80._0_8_;
              d3[0] = asVar47[0];
              d3[1] = asVar47[1];
              d3[2] = asVar47[2];
              d3[3] = asVar47[3];
              lVar48 = 0;
              do {
                *(undefined2 *)((long)pvVar72 + lVar48) = *(undefined2 *)((long)d0 + lVar48);
                *(undefined2 *)((long)pvVar72 + lVar48 + 8) = *(undefined2 *)((long)d1 + lVar48);
                *(undefined2 *)((long)pvVar72 + lVar48 + 0x10) = *(undefined2 *)((long)d2 + lVar48);
                *(undefined2 *)((long)pvVar72 + lVar48 + 0x18) = *(undefined2 *)((long)d3 + lVar48);
                lVar48 = lVar48 + 2;
              } while (lVar48 != 8);
              puVar65 = (uint *)((long)puVar65 + 2);
              puVar68 = (uint *)((long)puVar68 + 2);
              puVar43 = (uint *)((long)puVar43 + 2);
              puVar61 = (uint *)((long)puVar61 + 2);
              pvVar72 = (void *)((long)pvVar72 + 0x20);
              uVar44 = uVar44 + 1;
            } while (uVar44 != uVar55);
          }
          uVar74 = uVar74 + 1;
        } while (uVar74 != uVar59);
      }
      uVar63 = uVar63 + 1;
    } while (uVar63 != uVar58);
  }
  piVar28 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
  if (piVar28 != (int *)0x0) {
    LOCK();
    *piVar28 = *piVar28 + -1;
    UNLOCK();
    if (*piVar28 == 0) {
      if (local_198.allocator == (Allocator *)0x0) {
        if (local_198.data != (void *)0x0) {
          free(local_198.data);
        }
      }
      else {
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_198.cstep = 0;
  local_198.data = (void *)0x0;
  local_198.refcount._0_4_ = 0;
  local_198.refcount._4_4_ = 0;
  local_198.elemsize = 0;
  local_198.elempack = 0;
  local_198.h = 0;
  local_198.d = 0;
  local_198.c = 0;
  local_198.allocator = (Allocator *)0x0;
  local_198.dims = 0;
  local_198.w = 0;
  d0[0] = 0;
  d0[1] = 0;
  d0[2] = 0;
  d0[3] = 0;
  Mat::create((Mat *)d0,0x10,uVar60,_c_00,4,opt->workspace_allocator);
  uVar59 = uVar42 & 0xfffffffffffffffc;
  if (0 < _c_00 >> 2) {
    local_390 = kernel_tm->data;
    sVar29 = kernel_tm->elemsize;
    lVar48 = kernel_tm->cstep * sVar29;
    lVar53 = lVar48 * 4;
    local_320 = (void *)((long)local_390 + lVar48);
    local_328 = (void *)((long)local_390 + lVar48 * 2);
    local_330 = (void *)(lVar48 * 3 + (long)local_390);
    uVar63 = 0;
    do {
      if (0 < (int)uVar60) {
        iVar45 = kernel_tm->w;
        lVar54 = local_1f8 * local_238._16_8_;
        lVar62 = sVar29 * (long)iVar45;
        lVar1 = lVar54 * 4;
        local_3b8 = (void *)0x0;
        uVar74 = 0;
        do {
          uVar46 = 0;
          d1[0] = 0;
          d1[1] = 0;
          d1[2] = 0;
          d1[3] = 0;
          d2[0] = 0;
          d2[1] = 0;
          d2[2] = 0;
          d2[3] = 0;
          d3[0] = 0;
          d3[1] = 0;
          d3[2] = 0;
          d3[3] = 0;
          sum3[8] = 0;
          sum3[9] = 0;
          sum3[10] = 0;
          sum3[0xb] = 0;
          sum3[0xc] = 0;
          sum3[0xd] = 0;
          sum3[0xe] = 0;
          sum3[0xf] = 0;
          sum3[0] = 0;
          sum3[1] = 0;
          sum3[2] = 0;
          sum3[3] = 0;
          sum3[4] = 0;
          sum3[5] = 0;
          sum3[6] = 0;
          sum3[7] = 0;
          if (3 < (int)_c) {
            lVar52 = (long)(int)local_238._44_4_ * (long)local_3b8;
            pvVar72 = (void *)(local_238._0_8_ + lVar52);
            lVar66 = local_238._0_8_ + lVar52 + lVar54;
            lVar56 = local_238._0_8_ + lVar52 + lVar54 * 2;
            lVar52 = local_238._0_8_ + lVar52 + lVar54 * 3;
            uVar49 = 0;
            pvVar64 = local_390;
            do {
              lVar69 = 0;
              do {
                auVar76._8_8_ = 0;
                auVar76._0_8_ = *(ulong *)((long)pvVar72 + lVar69);
                auVar32 = vpmovsxwd_avx(auVar76);
                auVar2._8_8_ = 0;
                auVar2._0_8_ = *(ulong *)((long)pvVar64 + lVar69);
                auVar76 = vpmovzxwd_avx(auVar2);
                auVar76 = vpmaddwd_avx(auVar76,auVar32);
                auVar76 = vpaddd_avx(auVar76,*(undefined1 (*) [16])(d1 + lVar69));
                auVar80._8_8_ = 0;
                auVar80._0_8_ = *(ulong *)(lVar66 + lVar69);
                auVar33 = vpmovsxwd_avx(auVar80);
                auVar79._8_8_ = 0;
                auVar79._0_8_ = *(ulong *)((long)pvVar64 + lVar69 + 0x20);
                auVar2 = vpmovzxwd_avx(auVar79);
                auVar2 = vpmaddwd_avx(auVar2,auVar33);
                auVar30._8_8_ = 0;
                auVar30._0_8_ = *(ulong *)(lVar56 + lVar69);
                auVar79 = vpmovsxwd_avx(auVar30);
                auVar31._8_8_ = 0;
                auVar31._0_8_ = *(ulong *)((long)pvVar64 + lVar69 + 0x40);
                auVar80 = vpmovzxwd_avx(auVar31);
                auVar80 = vpmaddwd_avx(auVar80,auVar79);
                auVar2 = vpaddd_avx(auVar80,auVar2);
                auVar34._8_8_ = 0;
                auVar34._0_8_ = *(ulong *)(lVar52 + lVar69);
                auVar30 = vpmovsxwd_avx(auVar34);
                auVar35._8_8_ = 0;
                auVar35._0_8_ = *(ulong *)((long)pvVar64 + lVar69 + 0x60);
                auVar80 = vpmovzxwd_avx(auVar35);
                auVar80 = vpmaddwd_avx(auVar80,auVar30);
                auVar2 = vpaddd_avx(auVar80,auVar2);
                auVar76 = vpaddd_avx(auVar2,auVar76);
                *(undefined1 (*) [16])(d1 + lVar69) = auVar76;
                auVar36._8_8_ = 0;
                auVar36._0_8_ = *(ulong *)((long)pvVar64 + lVar48 + lVar69);
                auVar76 = vpmovzxwd_avx(auVar36);
                auVar76 = vpmaddwd_avx(auVar76,auVar32);
                auVar76 = vpaddd_avx(auVar76,*(undefined1 (*) [16])(d2 + lVar69));
                lVar50 = lVar48 + lVar69;
                auVar81._8_8_ = 0;
                auVar81._0_8_ = *(ulong *)((long)pvVar64 + lVar48 + 0x20 + lVar69);
                auVar2 = vpmovzxwd_avx(auVar81);
                auVar2 = vpmaddwd_avx(auVar2,auVar33);
                auVar3._8_8_ = 0;
                auVar3._0_8_ = *(ulong *)((long)pvVar64 + lVar48 + 0x40 + lVar69);
                auVar80 = vpmovzxwd_avx(auVar3);
                auVar80 = vpmaddwd_avx(auVar80,auVar79);
                auVar2 = vpaddd_avx(auVar80,auVar2);
                auVar4._8_8_ = 0;
                auVar4._0_8_ = *(ulong *)((long)pvVar64 + lVar48 + 0x60 + lVar69);
                auVar80 = vpmovzxwd_avx(auVar4);
                auVar80 = vpmaddwd_avx(auVar80,auVar30);
                auVar2 = vpaddd_avx(auVar80,auVar2);
                auVar76 = vpaddd_avx(auVar2,auVar76);
                *(undefined1 (*) [16])(d2 + lVar69) = auVar76;
                auVar5._8_8_ = 0;
                auVar5._0_8_ = *(ulong *)((long)pvVar64 + lVar48 + lVar50);
                auVar76 = vpmovzxwd_avx(auVar5);
                auVar76 = vpmaddwd_avx(auVar76,auVar32);
                auVar76 = vpaddd_avx(auVar76,*(undefined1 (*) [16])(d3 + lVar69));
                lVar57 = lVar48 + lVar50;
                auVar6._8_8_ = 0;
                auVar6._0_8_ = *(ulong *)((long)pvVar64 + lVar48 + 0x20 + lVar50);
                auVar2 = vpmovzxwd_avx(auVar6);
                auVar2 = vpmaddwd_avx(auVar2,auVar33);
                auVar7._8_8_ = 0;
                auVar7._0_8_ = *(ulong *)((long)pvVar64 + lVar48 + 0x40 + lVar50);
                auVar80 = vpmovzxwd_avx(auVar7);
                auVar80 = vpmaddwd_avx(auVar80,auVar79);
                auVar2 = vpaddd_avx(auVar80,auVar2);
                auVar8._8_8_ = 0;
                auVar8._0_8_ = *(ulong *)((long)pvVar64 + lVar48 + 0x60 + lVar50);
                auVar80 = vpmovzxwd_avx(auVar8);
                auVar80 = vpmaddwd_avx(auVar80,auVar30);
                auVar2 = vpaddd_avx(auVar80,auVar2);
                auVar76 = vpaddd_avx(auVar2,auVar76);
                *(undefined1 (*) [16])(d3 + lVar69) = auVar76;
                auVar9._8_8_ = 0;
                auVar9._0_8_ = *(ulong *)((long)pvVar64 + lVar48 + lVar57);
                auVar76 = vpmovzxwd_avx(auVar9);
                auVar76 = vpmaddwd_avx(auVar76,auVar32);
                auVar76 = vpaddd_avx(auVar76,*(undefined1 (*) [16])((long)sum3 + lVar69 * 2));
                auVar32._8_8_ = 0;
                auVar32._0_8_ = *(ulong *)((long)pvVar64 + lVar48 + 0x20 + lVar57);
                auVar2 = vpmovzxwd_avx(auVar32);
                auVar2 = vpmaddwd_avx(auVar2,auVar33);
                auVar33._8_8_ = 0;
                auVar33._0_8_ = *(ulong *)((long)pvVar64 + lVar48 + 0x40 + lVar57);
                auVar80 = vpmovzxwd_avx(auVar33);
                auVar80 = vpmaddwd_avx(auVar80,auVar79);
                auVar2 = vpaddd_avx(auVar80,auVar2);
                auVar10._8_8_ = 0;
                auVar10._0_8_ = *(ulong *)((long)pvVar64 + lVar48 + 0x60 + lVar57);
                auVar80 = vpmovzxwd_avx(auVar10);
                auVar80 = vpmaddwd_avx(auVar80,auVar30);
                auVar2 = vpaddd_avx(auVar80,auVar2);
                auVar76 = vpaddd_avx(auVar2,auVar76);
                *(undefined1 (*) [16])((long)sum3 + lVar69 * 2) = auVar76;
                lVar69 = lVar69 + 8;
              } while (lVar69 != 0x20);
              uVar46 = uVar49 + 4;
              lVar69 = uVar49 + 7;
              pvVar72 = (void *)((long)pvVar72 + lVar1);
              pvVar64 = (void *)((long)pvVar64 + (long)iVar45 * sVar29 * 4);
              lVar66 = lVar66 + lVar1;
              lVar56 = lVar56 + lVar1;
              lVar52 = lVar52 + lVar1;
              uVar49 = uVar46;
            } while (lVar69 < (int)_c);
          }
          if ((int)uVar46 < (int)_c) {
            uVar46 = uVar46 & 0xffffffff;
            lVar66 = local_238._0_8_ +
                     (long)(int)local_238._44_4_ * (long)local_3b8 + lVar54 * uVar46;
            lVar56 = lVar62 * uVar46;
            pvVar72 = (void *)((long)local_390 + lVar56);
            pvVar67 = (void *)((long)local_320 + lVar56);
            pvVar70 = (void *)((long)local_328 + lVar56);
            pvVar64 = (void *)(lVar56 + (long)local_330);
            do {
              lVar56 = 0;
              do {
                auVar11._8_8_ = 0;
                auVar11._0_8_ = *(ulong *)(lVar66 + lVar56);
                auVar2 = vpmovsxwd_avx(auVar11);
                auVar12._8_8_ = 0;
                auVar12._0_8_ = *(ulong *)((long)pvVar72 + lVar56);
                auVar76 = vpmovzxwd_avx(auVar12);
                auVar76 = vpmaddwd_avx(auVar76,auVar2);
                auVar76 = vpaddd_avx(auVar76,*(undefined1 (*) [16])(d1 + lVar56));
                *(undefined1 (*) [16])(d1 + lVar56) = auVar76;
                auVar13._8_8_ = 0;
                auVar13._0_8_ = *(ulong *)((long)pvVar67 + lVar56);
                auVar76 = vpmovzxwd_avx(auVar13);
                auVar76 = vpmaddwd_avx(auVar76,auVar2);
                auVar76 = vpaddd_avx(auVar76,*(undefined1 (*) [16])(d2 + lVar56));
                *(undefined1 (*) [16])(d2 + lVar56) = auVar76;
                auVar14._8_8_ = 0;
                auVar14._0_8_ = *(ulong *)((long)pvVar70 + lVar56);
                auVar76 = vpmovzxwd_avx(auVar14);
                auVar76 = vpmaddwd_avx(auVar76,auVar2);
                auVar76 = vpaddd_avx(auVar76,*(undefined1 (*) [16])(d3 + lVar56));
                *(undefined1 (*) [16])(d3 + lVar56) = auVar76;
                auVar15._8_8_ = 0;
                auVar15._0_8_ = *(ulong *)((long)pvVar64 + lVar56);
                auVar76 = vpmovzxwd_avx(auVar15);
                auVar76 = vpmaddwd_avx(auVar76,auVar2);
                auVar76 = vpaddd_avx(auVar76,*(undefined1 (*) [16])((long)sum3 + lVar56 * 2));
                *(undefined1 (*) [16])((long)sum3 + lVar56 * 2) = auVar76;
                lVar56 = lVar56 + 8;
              } while (lVar56 != 0x20);
              uVar46 = uVar46 + 1;
              lVar66 = lVar66 + lVar54;
              pvVar72 = (void *)((long)pvVar72 + lVar62);
              pvVar67 = (void *)((long)pvVar67 + lVar62);
              pvVar70 = (void *)((long)pvVar70 + lVar62);
              pvVar64 = (void *)((long)pvVar64 + lVar62);
            } while (uVar46 != uVar58);
          }
          lVar66 = 0;
          do {
            *(undefined4 *)((long)d0 + lVar66) = *(undefined4 *)((long)d1 + lVar66);
            *(undefined4 *)((long)d0 + lVar66) = *(undefined4 *)((long)d2 + lVar66);
            *(undefined4 *)((long)d0 + lVar66) = *(undefined4 *)((long)d3 + lVar66);
            *(undefined4 *)((long)d0 + lVar66) = *(undefined4 *)((long)sum3 + lVar66);
            lVar66 = lVar66 + 4;
          } while (lVar66 != 0x40);
          uVar74 = uVar74 + 1;
          local_3b8 = (void *)((long)local_3b8 + local_238._16_8_);
        } while (uVar74 != uVar60);
      }
      uVar63 = uVar63 + 1;
      local_390 = (void *)((long)local_390 + lVar53);
      local_320 = (void *)((long)local_320 + lVar53);
      local_328 = (void *)((long)local_328 + lVar53);
      local_330 = (void *)((long)local_330 + lVar53);
    } while (uVar63 != (uint)(_c_00 >> 2));
  }
  local_308 = (int)uVar59;
  if (local_308 != _c_00) {
    local_3a8 = kernel_tm->data;
    sVar29 = kernel_tm->elemsize;
    lVar53 = kernel_tm->cstep * sVar29;
    local_3b8 = (void *)(lVar53 * uVar59 + (long)local_3a8);
    lVar48 = kernel_tm->cstep * uVar59;
    do {
      if (0 < (int)uVar60) {
        lVar62 = (long)kernel_tm->w;
        lVar66 = local_1f8 * local_238._16_8_;
        lVar1 = lVar66 * 4;
        lVar54 = sVar29 * 4 * lVar62;
        lVar56 = 0;
        uVar63 = 0;
        do {
          uVar74 = 0;
          d1[0] = 0;
          d1[1] = 0;
          d1[2] = 0;
          d1[3] = 0;
          if (3 < (int)_c) {
            lVar50 = (int)local_238._44_4_ * lVar56;
            pvVar72 = (void *)(local_238._0_8_ + lVar50);
            lVar52 = local_238._0_8_ + lVar50 + lVar66;
            lVar69 = local_238._0_8_ + lVar50 + lVar66 * 2;
            lVar50 = local_238._0_8_ + lVar50 + lVar66 * 3;
            pvVar64 = (void *)((long)local_3b8 + sVar29 * lVar62);
            pvVar67 = (void *)(sVar29 * 3 * lVar62 + (long)local_3b8);
            pvVar70 = local_3b8;
            uVar46 = 0;
            pvVar75 = (void *)(sVar29 * 2 * lVar62 + (long)local_3b8);
            do {
              lVar57 = 0;
              do {
                auVar16._8_8_ = 0;
                auVar16._0_8_ = *(ulong *)((long)pvVar72 + lVar57);
                auVar76 = vpmovzxwd_avx(auVar16);
                auVar17._8_8_ = 0;
                auVar17._0_8_ = *(ulong *)((long)pvVar70 + lVar57);
                auVar2 = vpmovzxwd_avx(auVar17);
                auVar76 = vpmaddwd_avx(auVar2,auVar76);
                auVar76 = vpaddd_avx(auVar76,*(undefined1 (*) [16])(d1 + lVar57));
                auVar18._8_8_ = 0;
                auVar18._0_8_ = *(ulong *)(lVar52 + lVar57);
                auVar2 = vpmovzxwd_avx(auVar18);
                auVar19._8_8_ = 0;
                auVar19._0_8_ = *(ulong *)((long)pvVar64 + lVar57);
                auVar80 = vpmovzxwd_avx(auVar19);
                auVar2 = vpmaddwd_avx(auVar80,auVar2);
                auVar20._8_8_ = 0;
                auVar20._0_8_ = *(ulong *)(lVar69 + lVar57);
                auVar80 = vpmovzxwd_avx(auVar20);
                auVar21._8_8_ = 0;
                auVar21._0_8_ = *(ulong *)((long)pvVar75 + lVar57);
                auVar79 = vpmovzxwd_avx(auVar21);
                auVar80 = vpmaddwd_avx(auVar79,auVar80);
                auVar2 = vpaddd_avx(auVar80,auVar2);
                auVar22._8_8_ = 0;
                auVar22._0_8_ = *(ulong *)(lVar50 + lVar57);
                auVar80 = vpmovzxwd_avx(auVar22);
                auVar23._8_8_ = 0;
                auVar23._0_8_ = *(ulong *)((long)pvVar67 + lVar57);
                auVar79 = vpmovzxwd_avx(auVar23);
                auVar80 = vpmaddwd_avx(auVar79,auVar80);
                auVar2 = vpaddd_avx(auVar80,auVar2);
                auVar76 = vpaddd_avx(auVar2,auVar76);
                *(undefined1 (*) [16])(d1 + lVar57) = auVar76;
                lVar57 = lVar57 + 8;
              } while (lVar57 != 0x20);
              uVar74 = uVar46 + 4;
              lVar57 = uVar46 + 7;
              pvVar72 = (void *)((long)pvVar72 + lVar1);
              pvVar70 = (void *)((long)pvVar70 + lVar54);
              lVar52 = lVar52 + lVar1;
              pvVar64 = (void *)((long)pvVar64 + lVar54);
              lVar69 = lVar69 + lVar1;
              pvVar75 = (void *)((long)pvVar75 + lVar54);
              lVar50 = lVar50 + lVar1;
              pvVar67 = (void *)((long)pvVar67 + lVar54);
              uVar46 = uVar74;
            } while (lVar57 < (int)_c);
          }
          if ((int)uVar74 < (int)_c) {
            uVar74 = uVar74 & 0xffffffff;
            lVar52 = local_238._0_8_ + (int)local_238._44_4_ * lVar56 + lVar66 * uVar74;
            pvVar72 = (void *)((lVar62 * uVar74 + lVar48) * sVar29 + (long)local_3a8);
            do {
              lVar69 = 0;
              do {
                auVar24._8_8_ = 0;
                auVar24._0_8_ = *(ulong *)(lVar52 + lVar69 * 2);
                auVar76 = vpmovzxwd_avx(auVar24);
                auVar25._8_8_ = 0;
                auVar25._0_8_ = *(ulong *)((long)pvVar72 + lVar69 * 2);
                auVar2 = vpmovzxwd_avx(auVar25);
                auVar76 = vpmaddwd_avx(auVar2,auVar76);
                auVar76 = vpaddd_avx(auVar76,*(undefined1 (*) [16])(d1 + lVar69 * 2));
                *(undefined1 (*) [16])(d1 + lVar69 * 2) = auVar76;
                lVar69 = lVar69 + 4;
              } while (lVar69 != 0x10);
              uVar74 = uVar74 + 1;
              lVar52 = lVar52 + lVar66;
              pvVar72 = (void *)((long)pvVar72 + sVar29 * lVar62);
            } while (uVar74 != uVar58);
          }
          *(undefined8 *)((long)d0 + 0x20) = 0;
          *(undefined8 *)((long)d0 + 0x28) = 0;
          *(undefined8 *)((long)d0 + 0x30) = 0;
          *(undefined8 *)((long)d0 + 0x38) = 0;
          *(short (*) [4])d0 = d1;
          *(undefined8 *)((long)d0 + 8) = 0;
          *(undefined8 *)((long)d0 + 0x10) = 0;
          *(undefined8 *)((long)d0 + 0x18) = 0;
          uVar63 = uVar63 + 1;
          lVar56 = lVar56 + local_238._16_8_;
        } while (uVar63 != uVar60);
      }
      uVar59 = uVar59 + 1;
      local_3b8 = (void *)((long)local_3b8 + lVar53);
      local_3a8 = (void *)((long)local_3a8 + lVar53);
    } while ((long)uVar59 < (long)uVar42);
  }
  piVar28 = (int *)CONCAT44(local_238._12_4_,local_238._8_4_);
  if (piVar28 != (int *)0x0) {
    LOCK();
    *piVar28 = *piVar28 + -1;
    UNLOCK();
    if (*piVar28 == 0) {
      if ((Allocator *)local_238._32_8_ == (Allocator *)0x0) {
        if ((void *)local_238._0_8_ != (void *)0x0) {
          free((void *)local_238._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_238._32_8_)[3])();
      }
    }
  }
  local_1f8 = 0;
  local_238._0_8_ = (void *)0x0;
  local_238._8_4_ = 0;
  local_238._12_4_ = 0;
  local_238._16_8_ = 0;
  local_238._24_4_ = 0;
  local_238._48_12_ = SUB1612((undefined1  [16])0x0,4);
  local_238._32_8_ = (Allocator *)0x0;
  local_238._40_4_ = 0;
  local_238._44_4_ = 0;
  d1[0] = 0;
  d1[1] = 0;
  d1[2] = 0;
  d1[3] = 0;
  Mat::create((Mat *)d1,(int)local_148,_h,_c_00,4,opt->workspace_allocator);
  if (0 < _c_00) {
    uVar58 = 1;
    if (1 < (int)uVar71) {
      uVar58 = (ulong)uVar71;
    }
    uVar59 = 1;
    if (1 < (int)uVar73) {
      uVar59 = (ulong)uVar73;
    }
    local_3b0 = 0;
    do {
      if (0 < iVar27) {
        uVar63 = 0;
        do {
          asVar47 = d1;
          uVar74 = uVar58;
          if (0 < iVar26) {
            do {
              auVar76 = vpaddd_avx(*(undefined1 (*) [16])((long)d0 + 0x10),*(undefined1 (*) [16])d0)
              ;
              auVar76 = vpaddd_avx(auVar76,*(undefined1 (*) [16])((long)d0 + 0x20));
              auVar2 = vpsubd_avx(*(undefined1 (*) [16])((long)d0 + 0x10),
                                  *(undefined1 (*) [16])((long)d0 + 0x20));
              auVar2 = vpaddd_avx(auVar2,*(undefined1 (*) [16])((long)d0 + 0x30));
              sum3[0] = auVar76._12_4_;
              local_13c = auVar2._12_4_;
              auVar80 = vphaddd_avx(auVar76,auVar76);
              d2._0_4_ = auVar80._0_4_ + auVar76._8_4_;
              d3._0_4_ = (auVar76._4_4_ - auVar76._8_4_) + auVar76._12_4_;
              auVar76 = vphaddd_avx(auVar2,auVar2);
              d2._4_4_ = auVar76._0_4_ + auVar2._8_4_;
              asVar39 = d2;
              d3._4_4_ = (auVar2._4_4_ - auVar2._8_4_) + local_13c;
              asVar40 = d3;
              auVar77._8_8_ = 0;
              d2[1] = (short)((uint)d2._0_4_ >> 0x10);
              d2[3] = (short)((uint)d2._4_4_ >> 0x10);
              auVar77._0_2_ = d2[0];
              auVar77._2_2_ = d2[1];
              auVar77._4_2_ = d2[2];
              auVar77._6_2_ = d2[3];
              auVar76 = vpsrad_avx(auVar77,2);
              *(long *)asVar47 = auVar76._0_8_;
              auVar78._8_8_ = 0;
              d3[1] = (short)((uint)d3._0_4_ >> 0x10);
              d3[3] = (short)((uint)d3._4_4_ >> 0x10);
              auVar78._0_2_ = d3[0];
              auVar78._2_2_ = d3[1];
              auVar78._4_2_ = d3[2];
              auVar78._6_2_ = d3[3];
              auVar76 = vpsrad_avx(auVar78,2);
              *(long *)asVar47 = auVar76._0_8_;
              uVar74 = uVar74 - 1;
              asVar47 = (short  [4])((long)asVar47 + 8);
              d2 = asVar39;
              d3 = asVar40;
            } while (uVar74 != 0);
          }
          uVar63 = uVar63 + 1;
        } while (uVar63 != uVar59);
      }
      local_3b0 = local_3b0 + 1;
    } while (local_3b0 != uVar42);
  }
  copy_cut_border((Mat *)d1,local_150,0,-local_150->h,0,-local_150->w,opt);
  piVar28 = (int *)CONCAT44(local_238._12_4_,local_238._8_4_);
  if (piVar28 != (int *)0x0) {
    LOCK();
    *piVar28 = *piVar28 + -1;
    UNLOCK();
    if (*piVar28 == 0) {
      if ((Allocator *)local_238._32_8_ == (Allocator *)0x0) {
        if ((void *)local_238._0_8_ != (void *)0x0) {
          free((void *)local_238._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_238._32_8_)[3])();
      }
    }
  }
  piVar28 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
  if (piVar28 != (int *)0x0) {
    LOCK();
    *piVar28 = *piVar28 + -1;
    UNLOCK();
    if (*piVar28 == 0) {
      if (local_198.allocator == (Allocator *)0x0) {
        if (local_198.data != (void *)0x0) {
          free(local_198.data);
        }
      }
      else {
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2, winograd F(2,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        const int tiles = nColBlocks * nRowBlocks;

        bottom_blob_tm.create(4 * 4, tiles, inch, 2u, opt.workspace_allocator);

        // BT
        // const float itm[4][4] = {
        //     {1.0f,  0.0f, -1.0f,  0.0f},
        //     {0.0f,  1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  0.00f, 1.0f}
        // };

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < inch; q++)
        {
            const signed char* img = bottom_blob_bordered.channel(q);
            short* out_tm0 = bottom_blob_tm.channel(q);

            for (int j = 0; j < nColBlocks; j++)
            {
                const signed char* r0 = img + w * j * 2;
                const signed char* r1 = r0 + w;
                const signed char* r2 = r1 + w;
                const signed char* r3 = r2 + w;

                for (int i = 0; i < nRowBlocks; i++)
                {
                    short d0[4], d1[4], d2[4], d3[4];
                    short w0[4], w1[4], w2[4], w3[4];
                    short t0[4], t1[4], t2[4], t3[4];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = r0[n];
                        d1[n] = r1[n];
                        d2[n] = r2[n];
                        d3[n] = r3[n];
                    }
                    // w = B_t * d
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = d0[n] - d2[n];
                        w1[n] = d1[n] + d2[n];
                        w2[n] = d2[n] - d1[n];
                        w3[n] = d3[n] - d1[n];
                    }
                    // transpose d to d_t
                    {
                        t0[0] = w0[0];
                        t1[0] = w0[1];
                        t2[0] = w0[2];
                        t3[0] = w0[3];
                        t0[1] = w1[0];
                        t1[1] = w1[1];
                        t2[1] = w1[2];
                        t3[1] = w1[3];
                        t0[2] = w2[0];
                        t1[2] = w2[1];
                        t2[2] = w2[2];
                        t3[2] = w2[3];
                        t0[3] = w3[0];
                        t1[3] = w3[1];
                        t2[3] = w3[2];
                        t3[3] = w3[3];
                    }
                    // U = B_t * d_t
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = t0[n] - t2[n];
                        d1[n] = t1[n] + t2[n];
                        d2[n] = t2[n] - t1[n];
                        d3[n] = t3[n] - t1[n];
                    }
                    // save to out_tm
                    for (int n = 0; n < 4; n++)
                    {
                        out_tm0[n] = d0[n];
                        out_tm0[n + 4] = d1[n];
                        out_tm0[n + 8] = d2[n];
                        out_tm0[n + 12] = d3[n];
                    }

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    r3 += 2;

                    out_tm0 += 16;
                }
            }
        }
    }
    bottom_blob_bordered = Mat();

    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        const int tiles = nColBlocks * nRowBlocks;

        top_blob_tm.create(16, tiles, outch, 4u, opt.workspace_allocator);

        int nn_outch = outch >> 2;
        int remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int p = pp * 4;

            Mat out0_tm = top_blob_tm.channel(p);
            Mat out1_tm = top_blob_tm.channel(p + 1);
            Mat out2_tm = top_blob_tm.channel(p + 2);
            Mat out3_tm = top_blob_tm.channel(p + 3);

            const Mat kernel0_tm = kernel_tm.channel(p);
            const Mat kernel1_tm = kernel_tm.channel(p + 1);
            const Mat kernel2_tm = kernel_tm.channel(p + 2);
            const Mat kernel3_tm = kernel_tm.channel(p + 3);

            for (int i = 0; i < tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);
                int* output1_tm = out1_tm.row<int>(i);
                int* output2_tm = out2_tm.row<int>(i);
                int* output3_tm = out3_tm.row<int>(i);

                int sum0[16] = {0};
                int sum1[16] = {0};
                int sum2[16] = {0};
                int sum3[16] = {0};

                int q = 0;
                for (; q + 3 < inch; q += 4)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* r1 = bottom_blob_tm.channel(q + 1).row<short>(i);
                    const short* r2 = bottom_blob_tm.channel(q + 2).row<short>(i);
                    const short* r3 = bottom_blob_tm.channel(q + 3).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel1_tm.row<short>(q);
                    const short* k2 = kernel2_tm.row<short>(q);
                    const short* k3 = kernel3_tm.row<short>(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r1[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r2[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r3[n] * k0[n];
                        k0 -= 16 * 3;

                        sum1[n] += (int)r0[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r1[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r2[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r3[n] * k1[n];
                        k1 -= 16 * 3;

                        sum2[n] += (int)r0[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r1[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r2[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r3[n] * k2[n];
                        k2 -= 16 * 3;

                        sum3[n] += (int)r0[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r1[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r2[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r3[n] * k3[n];
                        k3 -= 16 * 3;
                    }
                }

                for (; q < inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel1_tm.row<short>(q);
                    const short* k2 = kernel2_tm.row<short>(q);
                    const short* k3 = kernel3_tm.row<short>(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        sum1[n] += (int)r0[n] * k1[n];
                        sum2[n] += (int)r0[n] * k2[n];
                        sum3[n] += (int)r0[n] * k3[n];
                    }
                }

                for (int n = 0; n < 16; n++)
                {
                    output0_tm[n] = sum0[n];
                    output1_tm[n] = sum1[n];
                    output2_tm[n] = sum2[n];
                    output3_tm[n] = sum3[n];
                }
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = remain_outch_start; p < outch; p++)
        {
            Mat out0_tm = top_blob_tm.channel(p);
            const Mat kernel0_tm = kernel_tm.channel(p);

            for (int i = 0; i < tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);

                int sum0[16] = {0};

                int q = 0;
                for (; q + 3 < inch; q += 4)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* r1 = bottom_blob_tm.channel(q + 1).row<short>(i);
                    const short* r2 = bottom_blob_tm.channel(q + 2).row<short>(i);
                    const short* r3 = bottom_blob_tm.channel(q + 3).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel0_tm.row<short>(q + 1);
                    const short* k2 = kernel0_tm.row<short>(q + 2);
                    const short* k3 = kernel0_tm.row<short>(q + 3);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        sum0[n] += (int)r1[n] * k1[n];
                        sum0[n] += (int)r2[n] * k2[n];
                        sum0[n] += (int)r3[n] * k3[n];
                    }
                }

                for (; q < inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* k0 = kernel0_tm.row<short>(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                    }
                }

                for (int n = 0; n < 16; n++)
                {
                    output0_tm[n] = sum0[n];
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    {
        // AT
        // const float itm[2][4] = {
        //     {1.0f,  1.0f,  1.0f,  0.0f},
        //     {0.0f,  1.0f, -1.0f,  1.0f}
        // };

        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < outch; p++)
        {
            Mat out_tm = top_blob_tm.channel(p);
            Mat out = top_blob_bordered.channel(p);

            for (int j = 0; j < nColBlocks; j++)
            {
                int* outRow0 = out.row<int>(j * 2);
                int* outRow1 = out.row<int>(j * 2 + 1);

                for (int i = 0; i < nRowBlocks; i++)
                {
                    int* out_tile = out_tm.row<int>(j * nRowBlocks + i);

                    int s0[4], s1[4], s2[4], s3[4];
                    int w0[4], w1[4];
                    int d0[2], d1[2], d2[2], d3[2];
                    int o0[2], o1[2];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        s0[n] = out_tile[n];
                        s1[n] = out_tile[n + 4];
                        s2[n] = out_tile[n + 8];
                        s3[n] = out_tile[n + 12];
                    }
                    // w = A_T * W
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = s0[n] + s1[n] + s2[n];
                        w1[n] = s1[n] - s2[n] + s3[n];
                    }
                    // transpose w to w_t
                    {
                        d0[0] = w0[0];
                        d0[1] = w1[0];
                        d1[0] = w0[1];
                        d1[1] = w1[1];
                        d2[0] = w0[2];
                        d2[1] = w1[2];
                        d3[0] = w0[3];
                        d3[1] = w1[3];
                    }
                    // Y = A_T * w_t
                    for (int n = 0; n < 2; n++)
                    {
                        o0[n] = d0[n] + d1[n] + d2[n];
                        o1[n] = d1[n] - d2[n] + d3[n];
                    }
                    // save to top blob tm,why right 2,because the G' = G*2
                    outRow0[0] = o0[0] >> 2;
                    outRow0[1] = o0[1] >> 2;
                    outRow1[0] = o1[0] >> 2;
                    outRow1[1] = o1[1] >> 2;

                    outRow0 += 2;
                    outRow1 += 2;
                }
            }
        }
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}